

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O0

void relational_suite::compare_array_with_array(void)

{
  size_type in_RCX;
  basic_variable<std::allocator<char>_> *pbVar1;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_00;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_01;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_02;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_03;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_04;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_05;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_06;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_07;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_08;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_09;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_10;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_11;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_12;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_13;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_14;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_15;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_16;
  basic_variable<std::allocator<char>_> *local_e88;
  basic_variable<std::allocator<char>_> *local_e70;
  basic_variable<std::allocator<char>_> *local_e58;
  basic_variable<std::allocator<char>_> *local_e40;
  basic_variable<std::allocator<char>_> *local_e28;
  basic_variable<std::allocator<char>_> *local_e10;
  basic_variable<std::allocator<char>_> *local_df8;
  basic_variable<std::allocator<char>_> *local_de0;
  basic_variable<std::allocator<char>_> *local_dc8;
  basic_variable<std::allocator<char>_> *local_db0;
  basic_variable<std::allocator<char>_> *local_d98;
  basic_variable<std::allocator<char>_> *local_d80;
  basic_variable<std::allocator<char>_> *local_d68;
  basic_variable<std::allocator<char>_> *local_d50;
  basic_variable<std::allocator<char>_> *local_d38;
  basic_variable<std::allocator<char>_> *local_d20;
  basic_variable<std::allocator<char>_> *local_d08;
  basic_variable<std::allocator<char>_> *local_cf0;
  undefined1 local_ce1;
  basic_variable<std::allocator<char>_> *local_ce0;
  basic_variable<std::allocator<char>_> local_cd8;
  undefined1 local_ca8 [72];
  basic_variable<std::allocator<char>_> *local_c60;
  basic_variable<std::allocator<char>_> local_c58;
  basic_variable<std::allocator<char>_> local_c28;
  undefined1 local_bf8 [69];
  undefined1 local_bb3 [2];
  undefined1 local_bb1;
  basic_variable<std::allocator<char>_> *local_bb0;
  basic_variable<std::allocator<char>_> local_ba8;
  basic_variable<std::allocator<char>_> local_b78;
  basic_variable<std::allocator<char>_> local_b48;
  undefined1 local_b18 [72];
  basic_variable<std::allocator<char>_> *local_ad0;
  basic_variable<std::allocator<char>_> local_ac8;
  basic_variable<std::allocator<char>_> local_a98;
  undefined1 local_a68 [69];
  undefined1 local_a23 [2];
  undefined1 local_a21;
  basic_variable<std::allocator<char>_> *local_a20;
  basic_variable<std::allocator<char>_> local_a18;
  basic_variable<std::allocator<char>_> local_9e8;
  basic_variable<std::allocator<char>_> local_9b8;
  undefined1 local_988 [72];
  basic_variable<std::allocator<char>_> *local_940;
  basic_variable<std::allocator<char>_> local_938;
  basic_variable<std::allocator<char>_> local_908;
  undefined1 local_8d8 [69];
  undefined1 local_893 [2];
  undefined1 local_891;
  basic_variable<std::allocator<char>_> *local_890;
  basic_variable<std::allocator<char>_> local_888;
  basic_variable<std::allocator<char>_> local_858;
  basic_variable<std::allocator<char>_> local_828;
  undefined1 local_7f8 [72];
  basic_variable<std::allocator<char>_> *local_7b0;
  basic_variable<std::allocator<char>_> local_7a8;
  basic_variable<std::allocator<char>_> local_778;
  undefined1 local_748 [69];
  undefined1 local_703 [2];
  undefined1 local_701;
  basic_variable<std::allocator<char>_> *local_700;
  basic_variable<std::allocator<char>_> local_6f8;
  basic_variable<std::allocator<char>_> local_6c8;
  undefined1 local_698 [72];
  basic_variable<std::allocator<char>_> *local_650;
  basic_variable<std::allocator<char>_> local_648;
  basic_variable<std::allocator<char>_> local_618;
  undefined1 local_5e8 [69];
  undefined1 local_5a3 [2];
  undefined1 local_5a1;
  basic_variable<std::allocator<char>_> *local_5a0;
  basic_variable<std::allocator<char>_> local_598;
  basic_variable<std::allocator<char>_> local_568;
  undefined1 local_538 [72];
  basic_variable<std::allocator<char>_> *local_4f0;
  basic_variable<std::allocator<char>_> local_4e8;
  basic_variable<std::allocator<char>_> local_4b8;
  undefined1 local_488 [69];
  undefined1 local_443 [2];
  undefined1 local_441;
  basic_variable<std::allocator<char>_> *local_440;
  basic_variable<std::allocator<char>_> local_438;
  basic_variable<std::allocator<char>_> local_408;
  undefined1 local_3d8 [72];
  basic_variable<std::allocator<char>_> *local_390;
  basic_variable<std::allocator<char>_> local_388;
  basic_variable<std::allocator<char>_> local_358;
  undefined1 local_328 [69];
  undefined1 local_2e3 [2];
  undefined1 local_2e1;
  basic_variable<std::allocator<char>_> *local_2e0;
  basic_variable<std::allocator<char>_> local_2d8;
  basic_variable<std::allocator<char>_> local_2a8;
  undefined1 local_278 [72];
  basic_variable<std::allocator<char>_> *local_230;
  basic_variable<std::allocator<char>_> local_228;
  basic_variable<std::allocator<char>_> local_1f8;
  undefined1 local_1c8 [69];
  undefined1 local_183 [2];
  undefined1 local_181;
  basic_variable<std::allocator<char>_> *local_180;
  basic_variable<std::allocator<char>_> local_178;
  basic_variable<std::allocator<char>_> local_148;
  undefined1 local_118 [88];
  basic_variable<std::allocator<char>_> *local_c0;
  basic_variable<std::allocator<char>_> local_b8;
  basic_variable<std::allocator<char>_> local_88;
  undefined1 local_58 [78];
  undefined1 local_a [2];
  
  local_c0 = &local_b8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_c0,0);
  local_c0 = &local_88;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_c0,1);
  local_58._0_8_ = &local_b8;
  local_58._8_8_ = 2;
  init._M_len = in_RCX;
  init._M_array = (iterator)0x2;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_58 + 0x10),
             (basic_array<std::allocator<char>_> *)local_58._0_8_,init);
  local_180 = &local_178;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_180,1);
  local_180 = &local_148;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_180,2);
  local_118._0_8_ = &local_178;
  local_118._8_8_ = 2;
  init_00._M_len = in_RCX;
  init_00._M_array = (iterator)0x2;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_118 + 0x10),
             (basic_array<std::allocator<char>_> *)local_118._0_8_,init_00);
  local_a[0] = trial::dynamic::operator<
                         ((basic_variable<std::allocator<char>_> *)(local_58 + 0x10),
                          (basic_variable<std::allocator<char>_> *)(local_118 + 0x10));
  local_181 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({0, 1}) < array::make({1, 2})","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1f80,"void relational_suite::compare_array_with_array()",local_a,&local_181);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_118 + 0x10));
  local_cf0 = (basic_variable<std::allocator<char>_> *)local_118;
  do {
    local_cf0 = local_cf0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_cf0);
  } while (local_cf0 != &local_178);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_58 + 0x10));
  pbVar1 = &local_b8;
  local_d08 = (basic_variable<std::allocator<char>_> *)local_58;
  do {
    local_d08 = local_d08 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_d08);
  } while (local_d08 != pbVar1);
  local_230 = &local_228;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_230,0);
  local_230 = &local_1f8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_230,1);
  local_1c8._0_8_ = &local_228;
  local_1c8._8_8_ = 2;
  init_01._M_len = (size_type)pbVar1;
  init_01._M_array = (iterator)0x2;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_1c8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_1c8._0_8_,init_01);
  local_2e0 = &local_2d8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_2e0,0);
  local_2e0 = &local_2a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_2e0,1);
  local_278._0_8_ = &local_2d8;
  local_278._8_8_ = 2;
  init_02._M_len = (size_type)pbVar1;
  init_02._M_array = (iterator)0x2;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_278 + 0x10),
             (basic_array<std::allocator<char>_> *)local_278._0_8_,init_02);
  local_183[0] = trial::dynamic::operator<
                           ((basic_variable<std::allocator<char>_> *)(local_1c8 + 0x10),
                            (basic_variable<std::allocator<char>_> *)(local_278 + 0x10));
  local_2e1 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({0, 1}) < array::make({0, 1})","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1f81,"void relational_suite::compare_array_with_array()",local_183,&local_2e1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_278 + 0x10));
  local_d20 = (basic_variable<std::allocator<char>_> *)local_278;
  do {
    local_d20 = local_d20 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_d20);
  } while (local_d20 != &local_2d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_1c8 + 0x10));
  pbVar1 = &local_228;
  local_d38 = (basic_variable<std::allocator<char>_> *)local_1c8;
  do {
    local_d38 = local_d38 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_d38);
  } while (local_d38 != pbVar1);
  local_390 = &local_388;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_390,0);
  local_390 = &local_358;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_390,1);
  local_328._0_8_ = &local_388;
  local_328._8_8_ = 2;
  init_03._M_len = (size_type)pbVar1;
  init_03._M_array = (iterator)0x2;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_328 + 0x10),
             (basic_array<std::allocator<char>_> *)local_328._0_8_,init_03);
  local_440 = &local_438;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_440,0);
  local_440 = &local_408;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_440,2);
  local_3d8._0_8_ = &local_438;
  local_3d8._8_8_ = 2;
  init_04._M_len = (size_type)pbVar1;
  init_04._M_array = (iterator)0x2;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_3d8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_3d8._0_8_,init_04);
  local_2e3[0] = trial::dynamic::operator<
                           ((basic_variable<std::allocator<char>_> *)(local_328 + 0x10),
                            (basic_variable<std::allocator<char>_> *)(local_3d8 + 0x10));
  local_441 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({0, 1}) < array::make({0, 2})","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1f82,"void relational_suite::compare_array_with_array()",local_2e3,&local_441);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_3d8 + 0x10));
  local_d50 = (basic_variable<std::allocator<char>_> *)local_3d8;
  do {
    local_d50 = local_d50 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_d50);
  } while (local_d50 != &local_438);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_328 + 0x10));
  pbVar1 = &local_388;
  local_d68 = (basic_variable<std::allocator<char>_> *)local_328;
  do {
    local_d68 = local_d68 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_d68);
  } while (local_d68 != pbVar1);
  local_4f0 = &local_4e8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_4f0,0);
  local_4f0 = &local_4b8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_4f0,1);
  local_488._0_8_ = &local_4e8;
  local_488._8_8_ = 2;
  init_05._M_len = (size_type)pbVar1;
  init_05._M_array = (iterator)0x2;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_488 + 0x10),
             (basic_array<std::allocator<char>_> *)local_488._0_8_,init_05);
  local_5a0 = &local_598;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_5a0,1);
  local_5a0 = &local_568;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_5a0,1);
  local_538._0_8_ = &local_598;
  local_538._8_8_ = 2;
  init_06._M_len = (size_type)pbVar1;
  init_06._M_array = (iterator)0x2;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_538 + 0x10),
             (basic_array<std::allocator<char>_> *)local_538._0_8_,init_06);
  local_443[0] = trial::dynamic::operator<
                           ((basic_variable<std::allocator<char>_> *)(local_488 + 0x10),
                            (basic_variable<std::allocator<char>_> *)(local_538 + 0x10));
  local_5a1 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({0, 1}) < array::make({1, 1})","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1f83,"void relational_suite::compare_array_with_array()",local_443,&local_5a1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_538 + 0x10));
  local_d80 = (basic_variable<std::allocator<char>_> *)local_538;
  do {
    local_d80 = local_d80 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_d80);
  } while (local_d80 != &local_598);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_488 + 0x10));
  pbVar1 = &local_4e8;
  local_d98 = (basic_variable<std::allocator<char>_> *)local_488;
  do {
    local_d98 = local_d98 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_d98);
  } while (local_d98 != pbVar1);
  local_650 = &local_648;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_650,0);
  local_650 = &local_618;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_650,1);
  local_5e8._0_8_ = &local_648;
  local_5e8._8_8_ = 2;
  init_07._M_len = (size_type)pbVar1;
  init_07._M_array = (iterator)0x2;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_5e8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_5e8._0_8_,init_07);
  local_700 = &local_6f8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_700,1);
  local_700 = &local_6c8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_700,0);
  local_698._0_8_ = &local_6f8;
  local_698._8_8_ = 2;
  init_08._M_len = (size_type)pbVar1;
  init_08._M_array = (iterator)0x2;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_698 + 0x10),
             (basic_array<std::allocator<char>_> *)local_698._0_8_,init_08);
  local_5a3[0] = trial::dynamic::operator<
                           ((basic_variable<std::allocator<char>_> *)(local_5e8 + 0x10),
                            (basic_variable<std::allocator<char>_> *)(local_698 + 0x10));
  local_701 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({0, 1}) < array::make({1, 0})","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1f84,"void relational_suite::compare_array_with_array()",local_5a3,&local_701);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_698 + 0x10));
  local_db0 = (basic_variable<std::allocator<char>_> *)local_698;
  do {
    local_db0 = local_db0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_db0);
  } while (local_db0 != &local_6f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_5e8 + 0x10));
  pbVar1 = &local_648;
  local_dc8 = (basic_variable<std::allocator<char>_> *)local_5e8;
  do {
    local_dc8 = local_dc8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_dc8);
  } while (local_dc8 != pbVar1);
  local_7b0 = &local_7a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_7b0,0);
  local_7b0 = &local_778;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_7b0,1);
  local_748._0_8_ = &local_7a8;
  local_748._8_8_ = 2;
  init_09._M_len = (size_type)pbVar1;
  init_09._M_array = (iterator)0x2;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_748 + 0x10),
             (basic_array<std::allocator<char>_> *)local_748._0_8_,init_09);
  local_890 = &local_888;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_890,0);
  local_890 = &local_858;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_890,1);
  local_890 = &local_828;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_890,2);
  local_7f8._0_8_ = &local_888;
  local_7f8._8_8_ = 3;
  init_10._M_len = (size_type)pbVar1;
  init_10._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_7f8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_7f8._0_8_,init_10);
  local_703[0] = trial::dynamic::operator<
                           ((basic_variable<std::allocator<char>_> *)(local_748 + 0x10),
                            (basic_variable<std::allocator<char>_> *)(local_7f8 + 0x10));
  local_891 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({0, 1}) < array::make({0, 1, 2})","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1f87,"void relational_suite::compare_array_with_array()",local_703,&local_891);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_7f8 + 0x10));
  local_de0 = (basic_variable<std::allocator<char>_> *)local_7f8;
  do {
    local_de0 = local_de0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_de0);
  } while (local_de0 != &local_888);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_748 + 0x10));
  pbVar1 = &local_7a8;
  local_df8 = (basic_variable<std::allocator<char>_> *)local_748;
  do {
    local_df8 = local_df8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_df8);
  } while (local_df8 != pbVar1);
  local_940 = &local_938;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_940,0);
  local_940 = &local_908;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_940,1);
  local_8d8._0_8_ = &local_938;
  local_8d8._8_8_ = 2;
  init_11._M_len = (size_type)pbVar1;
  init_11._M_array = (iterator)0x2;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_8d8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_8d8._0_8_,init_11);
  local_a20 = &local_a18;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_a20,0);
  local_a20 = &local_9e8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_a20,2);
  local_a20 = &local_9b8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_a20,3);
  local_988._0_8_ = &local_a18;
  local_988._8_8_ = 3;
  init_12._M_len = (size_type)pbVar1;
  init_12._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_988 + 0x10),
             (basic_array<std::allocator<char>_> *)local_988._0_8_,init_12);
  local_893[0] = trial::dynamic::operator<
                           ((basic_variable<std::allocator<char>_> *)(local_8d8 + 0x10),
                            (basic_variable<std::allocator<char>_> *)(local_988 + 0x10));
  local_a21 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({0, 1}) < array::make({0, 2, 3})","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1f88,"void relational_suite::compare_array_with_array()",local_893,&local_a21);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_988 + 0x10));
  local_e10 = (basic_variable<std::allocator<char>_> *)local_988;
  do {
    local_e10 = local_e10 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_e10);
  } while (local_e10 != &local_a18);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_8d8 + 0x10));
  pbVar1 = &local_938;
  local_e28 = (basic_variable<std::allocator<char>_> *)local_8d8;
  do {
    local_e28 = local_e28 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_e28);
  } while (local_e28 != pbVar1);
  local_ad0 = &local_ac8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_ad0,0);
  local_ad0 = &local_a98;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_ad0,1);
  local_a68._0_8_ = &local_ac8;
  local_a68._8_8_ = 2;
  init_13._M_len = (size_type)pbVar1;
  init_13._M_array = (iterator)0x2;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_a68 + 0x10),
             (basic_array<std::allocator<char>_> *)local_a68._0_8_,init_13);
  local_bb0 = &local_ba8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_bb0,1);
  local_bb0 = &local_b78;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_bb0,2);
  local_bb0 = &local_b48;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_bb0,3);
  local_b18._0_8_ = &local_ba8;
  local_b18._8_8_ = 3;
  init_14._M_len = (size_type)pbVar1;
  init_14._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_b18 + 0x10),
             (basic_array<std::allocator<char>_> *)local_b18._0_8_,init_14);
  local_a23[0] = trial::dynamic::operator<
                           ((basic_variable<std::allocator<char>_> *)(local_a68 + 0x10),
                            (basic_variable<std::allocator<char>_> *)(local_b18 + 0x10));
  local_bb1 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({0, 1}) < array::make({1, 2, 3})","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1f89,"void relational_suite::compare_array_with_array()",local_a23,&local_bb1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_b18 + 0x10));
  local_e40 = (basic_variable<std::allocator<char>_> *)local_b18;
  do {
    local_e40 = local_e40 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_e40);
  } while (local_e40 != &local_ba8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_a68 + 0x10));
  pbVar1 = &local_ac8;
  local_e58 = (basic_variable<std::allocator<char>_> *)local_a68;
  do {
    local_e58 = local_e58 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_e58);
  } while (local_e58 != pbVar1);
  local_c60 = &local_c58;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_c60,0);
  local_c60 = &local_c28;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_c60,1);
  local_bf8._0_8_ = &local_c58;
  local_bf8._8_8_ = 2;
  init_15._M_len = (size_type)pbVar1;
  init_15._M_array = (iterator)0x2;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_bf8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_bf8._0_8_,init_15);
  local_ce0 = &local_cd8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_ce0,1);
  local_ca8._0_8_ = &local_cd8;
  local_ca8._8_8_ = 1;
  init_16._M_len = (size_type)pbVar1;
  init_16._M_array = (iterator)0x1;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_ca8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_ca8._0_8_,init_16);
  local_bb3[0] = trial::dynamic::operator<
                           ((basic_variable<std::allocator<char>_> *)(local_bf8 + 0x10),
                            (basic_variable<std::allocator<char>_> *)(local_ca8 + 0x10));
  local_ce1 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({0, 1}) < array::make({1})","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1f8a,"void relational_suite::compare_array_with_array()",local_bb3,&local_ce1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_ca8 + 0x10));
  local_e70 = (basic_variable<std::allocator<char>_> *)local_ca8;
  do {
    local_e70 = local_e70 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_e70);
  } while (local_e70 != &local_cd8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_bf8 + 0x10));
  local_e88 = (basic_variable<std::allocator<char>_> *)local_bf8;
  do {
    local_e88 = local_e88 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_e88);
  } while (local_e88 != &local_c58);
  return;
}

Assistant:

void compare_array_with_array()
{
    TRIAL_PROTOCOL_TEST_EQUAL(array::make({0, 1}) < array::make({1, 2}), true);
    TRIAL_PROTOCOL_TEST_EQUAL(array::make({0, 1}) < array::make({0, 1}), false);
    TRIAL_PROTOCOL_TEST_EQUAL(array::make({0, 1}) < array::make({0, 2}), false);
    TRIAL_PROTOCOL_TEST_EQUAL(array::make({0, 1}) < array::make({1, 1}), false);
    TRIAL_PROTOCOL_TEST_EQUAL(array::make({0, 1}) < array::make({1, 0}), false);

    // Different sizes
    TRIAL_PROTOCOL_TEST_EQUAL(array::make({0, 1}) < array::make({0, 1, 2}), false);
    TRIAL_PROTOCOL_TEST_EQUAL(array::make({0, 1}) < array::make({0, 2, 3}), false);
    TRIAL_PROTOCOL_TEST_EQUAL(array::make({0, 1}) < array::make({1, 2, 3}), true);
    TRIAL_PROTOCOL_TEST_EQUAL(array::make({0, 1}) < array::make({1}), false);
}